

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1f8c447::BlendA64Mask1DTestHBD_ExtremeValues_Test::TestBody
          (BlendA64Mask1DTestHBD_ExtremeValues_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  short sVar2;
  uint32_t uVar3;
  int bsize;
  int iVar4;
  long lVar5;
  
  this_00 = &(this->super_BlendA64Mask1DTestHBD).
             super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
             .rng_;
  (this->super_BlendA64Mask1DTestHBD).bit_depth_ = 8;
  iVar4 = 8;
  do {
    sVar2 = (short)(1 << ((byte)iVar4 & 0x1f)) + -2;
    lVar5 = 0x3c024;
    do {
      uVar3 = testing::internal::Random::Generate(&this_00->random_,2);
      *(short *)((long)this + lVar5 * 2 + -0x78010) = (short)uVar3 + sVar2;
      uVar3 = testing::internal::Random::Generate(&this_00->random_,2);
      *(short *)((long)this + lVar5 * 2 + -0x50010) = (short)uVar3 + sVar2;
      uVar3 = testing::internal::Random::Generate(&this_00->random_,2);
      *(short *)((long)this + lVar5 * 2 + -0x28008) = (short)uVar3 + sVar2;
      uVar3 = testing::internal::Random::Generate(&this_00->random_,2);
      (this->super_BlendA64Mask1DTestHBD).
      super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      .dst_ref_[lVar5 + -0x1c] = (short)uVar3 + sVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x50024);
    lVar5 = 0xa0050;
    do {
      uVar3 = testing::internal::Random::Generate(&this_00->random_,2);
      *(char *)((long)(this->super_BlendA64Mask1DTestHBD).
                      super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                      .dst_ref_ + lVar5 + -0x38) = (char)uVar3 + '?';
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xa0150);
    iVar4 = 0;
    do {
      BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      ::Common((BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                *)this,iVar4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x16);
    iVar1 = (this->super_BlendA64Mask1DTestHBD).bit_depth_;
    iVar4 = iVar1 + 2;
    (this->super_BlendA64Mask1DTestHBD).bit_depth_ = iVar4;
  } while (iVar1 < 0xb);
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, ExtremeValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    const int hi = 1 << bit_depth_;
    const int lo = hi - 2;

    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_(hi - lo) + lo;
      dst_tst_[i] = rng_(hi - lo) + lo;
      src0_[i] = rng_(hi - lo) + lo;
      src1_[i] = rng_(hi - lo) + lo;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      Common(bsize);
    }
  }
}